

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.h
# Opt level: O2

RegSlot __thiscall
Js::AsmJSByteCodeGenerator::GetAndReleaseUnaryLocations<float>
          (AsmJSByteCodeGenerator *this,EmitExpressionInfo *rhs)

{
  bool bVar1;
  RegSlot RVar2;
  
  bVar1 = AsmJsFunc::IsTmpLocation<float>(this->mFunction,rhs);
  if (bVar1) {
    RVar2 = (rhs->super_EmitInfoBase).location;
  }
  else {
    RVar2 = AsmJsFunc::AcquireTmpRegister<float>(this->mFunction);
    AsmJsFunc::ReleaseLocation<float>(this->mFunction,rhs);
  }
  return RVar2;
}

Assistant:

RegSlot GetAndReleaseUnaryLocations( const EmitExpressionInfo* rhs )
        {
            RegSlot tmpRegToUse;
            if( mFunction->IsTmpLocation<T>( rhs ) )
            {
                tmpRegToUse = rhs->location;
            }
            else
            {
                tmpRegToUse = mFunction->AcquireTmpRegister<T>();
                mFunction->ReleaseLocation<T>( rhs );
            }
            return tmpRegToUse;
        }